

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::~MidiFile(MidiFile *this)

{
  MidiEventList *this_00;
  pointer p_Var1;
  pointer pcVar2;
  pointer ppMVar3;
  
  (this->m_readFileName)._M_string_length = 0;
  *(this->m_readFileName)._M_dataplus._M_p = '\0';
  clear(this);
  this_00 = *(this->m_events).
             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (this_00 != (MidiEventList *)0x0) {
    MidiEventList::~MidiEventList(this_00);
    operator_delete(this_00);
    *(this->m_events).
     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
     super__Vector_impl_data._M_start = (MidiEventList *)0x0;
  }
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,0);
  this->m_rwstatus = false;
  p_Var1 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var1) {
    (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var1;
  }
  this->m_timemapvalid = false;
  if (p_Var1 != (pointer)0x0) {
    operator_delete(p_Var1);
  }
  pcVar2 = (this->m_readFileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_readFileName).field_2) {
    operator_delete(pcVar2);
  }
  ppMVar3 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar3 != (pointer)0x0) {
    operator_delete(ppMVar3);
    return;
  }
  return;
}

Assistant:

MidiFile::~MidiFile() {
	m_readFileName.clear();
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
		m_events[0] = NULL;
	}
	m_events.resize(0);
	m_rwstatus = false;
	m_timemap.clear();
	m_timemapvalid = 0;
}